

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topological_sort.h
# Opt level: O3

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
wasm::TopologicalSort::minSort<std::less<unsigned_int>>
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__)

{
  TopologicalOrdersImpl<std::less<unsigned_int>_> local_80;
  
  TopologicalOrdersImpl<std::less<unsigned_int>_>::TopologicalOrdersImpl(&local_80);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,&local_80.buf);
  if (local_80.selectors.
      super__Vector_base<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.selectors.
                    super__Vector_base<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_80.selectors.
                          super__Vector_base<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.selectors.
                          super__Vector_base<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_80.choiceHeap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.choiceHeap.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.choiceHeap.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.choiceHeap.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_80.buf.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.buf.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_80.buf.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.buf.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_80.indegrees.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.indegrees.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.indegrees.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.indegrees.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Index> minSort(const Graph& graph, Cmp cmp) {
  return *TopologicalOrdersImpl<Cmp>(graph, cmp);
}